

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nurbs.h
# Opt level: O0

Index anurbs::Nurbs::upper_bound<std::vector<double,std::allocator<double>>>
                (vector<double,_std::allocator<double>_> *values,Index first,Index last,double value
                )

{
  long lVar1;
  reference pvVar2;
  Index step;
  Index i;
  Index count;
  double value_local;
  Index last_local;
  Index first_local;
  vector<double,_std::allocator<double>_> *values_local;
  
  lVar1 = last - first;
  last_local = first;
  while (i = lVar1, 0 < i) {
    lVar1 = i / 2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](values,lVar1 + last_local);
    if (*pvVar2 <= value) {
      last_local = lVar1 + last_local + 1;
      lVar1 = i - (lVar1 + 1);
    }
  }
  return last_local;
}

Assistant:

static Index upper_bound(TKnots values, Index first, Index last, double value)
    {
        auto count = last - first;
        Index i, step;
    
        while (count > 0) {
            i = first; 
            step = count / 2; 
            i += step;
            if (!(value < values[i])) {
                first = ++i;
                count -= step + 1;
            } else {
                count = step;
            }
        }
        return first;
    }